

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateServiceFile
               (FileDescriptor *file,ServiceDescriptor *service,bool is_descriptor,
               GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ulong uVar3;
  long *in_RCX;
  byte in_DL;
  ServiceDescriptor *in_RSI;
  FileDescriptor *in_RDI;
  MethodDescriptor *method;
  int i;
  int lastindex;
  string fullname;
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string filename;
  Printer *in_stack_fffffffffffffe38;
  Printer *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Printer *in_stack_fffffffffffffe50;
  string *filename_00;
  Printer *printer_00;
  Printer *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int iVar4;
  int index;
  Printer *in_stack_fffffffffffffea0;
  bool in_stack_fffffffffffffeb7;
  ServiceDescriptor *in_stack_fffffffffffffeb8;
  string local_140 [36];
  int local_11c;
  string local_118 [80];
  MethodDescriptor *in_stack_ffffffffffffff38;
  Printer *in_stack_ffffffffffffff40;
  undefined1 local_48 [8];
  long *local_20;
  byte local_11;
  ServiceDescriptor *local_10;
  undefined8 local_8;
  
  local_11 = in_DL & 1;
  printer_00 = (Printer *)&stack0xffffffffffffffc0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  GeneratedServiceFileName_abi_cxx11_(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb7);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*local_20 + 0x10))(local_20,printer_00);
  filename_00 = (string *)local_48;
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              *)in_stack_fffffffffffffe40,(pointer)in_stack_fffffffffffffe38);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         *)in_stack_fffffffffffffe40);
  io::Printer::Printer
            (in_stack_fffffffffffffe50,
             (ZeroCopyOutputStream *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (char)((ulong)in_stack_fffffffffffffe40 >> 0x38));
  GenerateHead((FileDescriptor *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  FilenameToClassname(filename_00);
  local_11c = std::__cxx11::string::find_last_of((char *)local_118,0x7627d6);
  FileDescriptor::options((FileDescriptor *)local_8);
  FileOptions::php_namespace_abi_cxx11_((FileOptions *)0x4aa852);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    FileDescriptor::options((FileDescriptor *)local_8);
    bVar1 = FileOptions::has_php_namespace((FileOptions *)0x4aa887);
    if (!bVar1) {
      in_stack_fffffffffffffe50 =
           (Printer *)FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) goto LAB_004aa8cd;
    }
    if (local_11c == -1) goto LAB_004aa9b1;
  }
LAB_004aa8cd:
  std::__cxx11::string::substr((ulong)local_140,(ulong)local_118);
  io::Printer::Print<char[5],std::__cxx11::string>
            (in_stack_fffffffffffffea0,
             (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             &in_stack_fffffffffffffe90->variable_delimiter_,args_1);
  std::__cxx11::string::~string(local_140);
LAB_004aa9b1:
  GenerateServiceDocComment(printer_00,(ServiceDescriptor *)filename_00);
  if (local_11c == -1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffea0,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               &in_stack_fffffffffffffe90->variable_delimiter_,args_1);
  }
  else {
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffea0,(ulong)local_118);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffea0,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               &in_stack_fffffffffffffe90->variable_delimiter_,args_1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
  }
  Indent((Printer *)0x4aaa82);
  iVar4 = 0;
  while (index = iVar4, iVar2 = ServiceDescriptor::method_count(local_10), iVar4 < iVar2) {
    in_stack_fffffffffffffe40 = (Printer *)ServiceDescriptor::method(local_10,index);
    in_stack_fffffffffffffe90 = in_stack_fffffffffffffe40;
    GenerateServiceMethodDocComment(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    GenerateServiceMethod
              ((MethodDescriptor *)in_stack_fffffffffffffea0,
               (Printer *)CONCAT44(index,in_stack_fffffffffffffe98));
    iVar4 = index + 1;
  }
  Outdent((Printer *)0x4aab19);
  io::Printer::Print<>(in_stack_fffffffffffffe90,(char *)args_1);
  std::__cxx11::string::~string(local_118);
  io::Printer::~Printer(in_stack_fffffffffffffe40);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void GenerateServiceFile(const FileDescriptor* file,
  const ServiceDescriptor* service, bool is_descriptor,
  GeneratorContext* generator_context) {
  std::string filename = GeneratedServiceFileName(service, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->options().php_namespace().empty() ||
      (!file->options().has_php_namespace() && !file->package().empty()) ||
      lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateServiceDocComment(&printer, service);

  if (lastindex != string::npos) {
      printer.Print(
        "interface ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
      printer.Print(
        "interface ^name^\n"
        "{\n",
        "name", fullname);
  }

  Indent(&printer);

  for (int i = 0; i < service->method_count(); i++) {
    const MethodDescriptor* method = service->method(i);
    GenerateServiceMethodDocComment(&printer, method);
    GenerateServiceMethod(method, &printer);
  }

  Outdent(&printer);
  printer.Print("}\n\n");
}